

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

int ON_CompareDoubleArray(size_t count,double *a,double *b)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  
  if (a == b || count == 0) {
    return 0;
  }
  if (a == (double *)0x0) {
    return 1;
  }
  if (b == (double *)0x0) {
    return -1;
  }
  dVar1 = *a;
  dVar2 = *b;
  if (dVar2 <= dVar1) {
    if (dVar2 < dVar1) {
      return 1;
    }
    uVar3 = 0;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      if (!NAN(dVar1)) goto LAB_0056e2c9;
      uVar3 = (uint)!NAN(dVar2);
    }
    if (1 < (long)count && (char)uVar3 == '\0') {
      pdVar4 = b + 1;
      pdVar5 = a + 2;
      do {
        dVar1 = pdVar5[-1];
        dVar2 = *pdVar4;
        if (dVar1 < dVar2) goto LAB_0056e2c9;
        if (dVar2 < dVar1) {
          return 1;
        }
        uVar3 = 0;
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (!NAN(dVar1)) goto LAB_0056e2c9;
          uVar3 = (uint)!NAN(dVar2);
        }
        if (uVar3 != 0) {
          return uVar3;
        }
        pdVar4 = pdVar4 + 1;
        bVar6 = pdVar5 < a + count;
        uVar3 = 0;
        pdVar5 = pdVar5 + 1;
      } while (bVar6);
    }
  }
  else {
LAB_0056e2c9:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

int ON_CompareDoubleArray(
  size_t count,
  const double* a,
  const double* b
  )
{
  if (count <= 0)
    return 0;
  if (a == b)
    return 0;
  if (nullptr == a)
    return 1;
  if (nullptr == b)
    return -1;
  return Internal_DoubleArrayCompare(count, a, b);
}